

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn,int *pbRetryLimit)

{
  u32 *puVar1;
  u16 *puVar2;
  byte *pbVar3;
  sqlite3_index_constraint_usage *psVar4;
  WhereTerm **ppWVar5;
  byte bVar6;
  uint uVar7;
  WhereClause *pWC;
  sqlite3_index_constraint_usage *__s;
  WhereLoop *pTemplate;
  Parse *pParse;
  SrcList *pSVar8;
  Table *pTab;
  sqlite3 *psVar9;
  sqlite3_vtab *psVar10;
  i8 iVar11;
  LogEst LVar12;
  int ii;
  int iVar13;
  WhereTerm *pWVar14;
  VTable *pVVar15;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uchar *puVar23;
  sqlite3_index_constraint *psVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  bool bVar28;
  
  pWC = pBuilder->pWC;
  __s = pIdxInfo->aConstraintUsage;
  pTemplate = pBuilder->pNew;
  pParse = pBuilder->pWInfo->pParse;
  pSVar8 = pBuilder->pWInfo->pTabList;
  bVar6 = pTemplate->iTab;
  uVar7 = pIdxInfo->nConstraint;
  *pbIn = 0;
  pTemplate->prereq = mPrereq;
  uVar20 = 0;
  if (0 < (int)uVar7) {
    uVar20 = uVar7;
  }
  puVar23 = &pIdxInfo->aConstraint->usable;
  uVar21 = uVar20;
  while (bVar28 = uVar21 != 0, uVar21 = uVar21 - 1, bVar28) {
    pWVar14 = termFromWhereClause(pWC,*(int *)(puVar23 + 3));
    *puVar23 = '\0';
    if ((((pWVar14->prereqRight & ~mUsable) == 0) && ((pWVar14->eOperator & mExclude) == 0)) &&
       ((pbRetryLimit != (int *)0x0 || ((byte)(pWVar14->eMatchOp + 0xb5) < 0xfe)))) {
      *puVar23 = '\x01';
    }
    puVar23 = puVar23 + 0xc;
  }
  memset(__s,0,(long)(int)uVar7 * 8);
  pIdxInfo->idxStr = (char *)0x0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = 5e+98;
  pIdxInfo->estimatedRows = 0x19;
  pIdxInfo->idxFlags = 0;
  *(undefined4 *)&pIdxInfo[1].aOrderBy = 0;
  pTab = pSVar8->a[bVar6].pSTab;
  psVar9 = pParse->db;
  pVVar15 = sqlite3GetVTable(psVar9,pTab);
  psVar10 = pVVar15->pVtab;
  puVar1 = &psVar9->nSchemaLock;
  *puVar1 = *puVar1 + 1;
  iVar13 = (*psVar10->pModule->xBestIndex)(psVar10,pIdxInfo);
  psVar9 = pParse->db;
  puVar1 = &psVar9->nSchemaLock;
  *puVar1 = *puVar1 - 1;
  if ((iVar13 != 0) && (iVar13 != 0x13)) {
    if (iVar13 == 7) {
      sqlite3OomFault(psVar9);
    }
    else {
      pcVar16 = psVar10->zErrMsg;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = sqlite3ErrStr(iVar13);
      }
      sqlite3ErrorMsg(pParse,"%s",pcVar16);
    }
  }
  if (((pTab->u).vtab.p)->bAllSchemas != '\0') {
    iVar22 = pParse->db->nDb;
    iVar26 = 0;
    if (iVar22 < 1) {
      iVar22 = iVar26;
    }
    for (; iVar22 != iVar26; iVar26 = iVar26 + 1) {
      sqlite3CodeVerifySchema(pParse,iVar26);
    }
    if (pParse->writeMask != 0) {
      for (iVar26 = 0; iVar22 != iVar26; iVar26 = iVar26 + 1) {
        sqlite3BeginWriteOperation(pParse,0,iVar26);
      }
    }
  }
  sqlite3_free(psVar10->zErrMsg);
  psVar10->zErrMsg = (char *)0x0;
  if (iVar13 == 0) {
    memset(pTemplate->aLTerm,0,(long)(int)uVar7 * 8);
    (pTemplate->u).btree.pOrderBy = (ExprList *)0x0;
    *(undefined8 *)&pTemplate->u = 0;
    (pTemplate->u).btree.pIndex = (Index *)0x0;
    psVar24 = pIdxInfo->aConstraint;
    uVar21 = 0xffffffff;
    for (uVar25 = 0; uVar25 != uVar20; uVar25 = uVar25 + 1) {
      iVar13 = __s[uVar25].argvIndex;
      if (0 < iVar13) {
        if ((((int)uVar7 < iVar13) || (psVar24->iTermOffset < 0)) ||
           (pWVar14 = termFromWhereClause(pWC,psVar24->iTermOffset), pWVar14 == (WhereTerm *)0x0))
        goto LAB_0018c2b2;
        uVar27 = iVar13 - 1;
        if ((pTemplate->aLTerm[uVar27] != (WhereTerm *)0x0) || (psVar24->usable == '\0'))
        goto LAB_0018c2b2;
        pTemplate->prereq = pTemplate->prereq | pWVar14->prereqRight;
        pTemplate->aLTerm[uVar27] = pWVar14;
        if ((int)uVar21 < (int)uVar27) {
          uVar21 = uVar27;
        }
        if (__s[uVar25].omit != '\0') {
          if ((uVar25 < 0x10) && ((mNoOmit >> ((uint)uVar25 & 0x1f) & 1) == 0)) {
            puVar2 = &(pTemplate->u).btree.nDistinctCol;
            *puVar2 = *puVar2 | (ushort)(1 << ((byte)uVar27 & 0x1f));
          }
          if (pWVar14->eMatchOp == 'J') {
            pbVar3 = (byte *)((long)&pTemplate->u + 4);
            *pbVar3 = *pbVar3 | 2;
          }
        }
        uVar19 = 1 << ((byte)uVar25 & 0x1f);
        if (0x1f < uVar25) {
          uVar19 = 0;
        }
        if ((*(uint *)&pIdxInfo[1].aOrderBy & uVar19) == 0) {
          if ((pWVar14->eOperator & 1) != 0) {
            pIdxInfo->orderByConsumed = 0;
            *(byte *)&pIdxInfo->idxFlags = (byte)pIdxInfo->idxFlags & 0xfe;
            *pbIn = 1;
          }
        }
        else {
          puVar1 = &(pTemplate->u).vtab.mHandleIn;
          *puVar1 = *puVar1 | 1 << ((byte)uVar27 & 0x1f);
        }
        if (0xfd < (byte)(pWVar14->eMatchOp + 0xb5)) {
          if (*pbIn != 0) {
LAB_0018c26a:
            freeIdxStr(pIdxInfo);
            *pbRetryLimit = 1;
            goto LAB_0018c280;
          }
          uVar17 = 0;
          while (uVar25 != uVar17) {
            psVar4 = __s + uVar17;
            uVar17 = uVar17 + 1;
            if (psVar4->argvIndex < 1) goto LAB_0018c26a;
          }
        }
      }
      psVar24 = psVar24 + 1;
    }
    pTemplate->nLTerm = (short)uVar21 + 1;
    lVar18 = 0;
    do {
      if ((int)uVar21 < lVar18) {
        (pTemplate->u).vtab.idxNum = pIdxInfo->idxNum;
        *(byte *)((long)&pTemplate->u + 4) =
             *(byte *)((long)&pTemplate->u + 4) & 0xfe | (byte)pIdxInfo->needToFreeIdxStr & 1;
        pIdxInfo->needToFreeIdxStr = 0;
        (pTemplate->u).btree.pIndex = (Index *)pIdxInfo->idxStr;
        if (pIdxInfo->orderByConsumed == 0) {
          iVar11 = '\0';
        }
        else {
          iVar11 = (i8)pIdxInfo->nOrderBy;
        }
        (pTemplate->u).vtab.isOrdered = iVar11;
        *(byte *)((long)&pTemplate->u + 4) =
             *(byte *)((long)&pTemplate->u + 4) & 0xfb | (char)pIdxInfo->idxFlags * '\x02' & 4U;
        pTemplate->rSetup = 0;
        LVar12 = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
        pTemplate->rRun = LVar12;
        LVar12 = sqlite3LogEst(pIdxInfo->estimatedRows);
        pTemplate->nOut = LVar12;
        pTemplate->wsFlags = (pIdxInfo->idxFlags & 1U) << 0xc | pTemplate->wsFlags & 0xffffefff;
        iVar13 = whereLoopInsert(pBuilder,pTemplate);
        if ((undefined1  [24])((undefined1  [24])pTemplate->u & (undefined1  [24])0x100000000) ==
            (undefined1  [24])0x0) {
          return iVar13;
        }
        sqlite3_free((pTemplate->u).btree.pIndex);
        pbVar3 = (byte *)((long)&pTemplate->u + 4);
        *pbVar3 = *pbVar3 & 0xfe;
        return iVar13;
      }
      ppWVar5 = pTemplate->aLTerm + lVar18;
      lVar18 = lVar18 + 1;
    } while (*ppWVar5 != (WhereTerm *)0x0);
LAB_0018c2b2:
    sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(pSVar8->a[bVar6].pSTab)->zName);
    freeIdxStr(pIdxInfo);
    iVar13 = 1;
  }
  else if (iVar13 == 0x13) {
    freeIdxStr(pIdxInfo);
LAB_0018c280:
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn,                      /* OUT: True if plan uses an IN(...) op */
  int *pbRetryLimit               /* OUT: Retry without LIMIT/OFFSET */
){
  WhereClause *pWC = pBuilder->pWC;
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  SrcItem *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = termFromWhereClause(pWC, pIdxCons->iTermOffset);
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight
     && (pTerm->eOperator & mExclude)==0
     && (pbRetryLimit || !isLimitTerm(pTerm))
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pHidden->mHandleIn = 0;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pSTab, pIdxInfo);
  if( rc ){
    if( rc==SQLITE_CONSTRAINT ){
      /* If the xBestIndex method returns SQLITE_CONSTRAINT, that means
      ** that the particular combination of parameters provided is unusable.
      ** Make no entries in the loop table.
      */
      WHERETRACE(0xffffffff, ("  ^^^^--- non-viable plan rejected!\n"));
      freeIdxStr(pIdxInfo);
      return SQLITE_OK;
    }
    return rc;
  }

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  memset(pNew->aLTerm, 0, sizeof(pNew->aLTerm[0])*nConstraint );
  memset(&pNew->u.vtab, 0, sizeof(pNew->u.vtab));
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || (pTerm = termFromWhereClause(pWC, j))==0
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pSTab->zName);
        freeIdxStr(pIdxInfo);
        return SQLITE_ERROR;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( pUsage[i].omit ){
        if( i<16 && ((1<<i)&mNoOmit)==0 ){
          testcase( i!=iTerm );
          pNew->u.vtab.omitMask |= 1<<iTerm;
        }else{
          testcase( i!=iTerm );
        }
        if( pTerm->eMatchOp==SQLITE_INDEX_CONSTRAINT_OFFSET ){
          pNew->u.vtab.bOmitOffset = 1;
        }
      }
      if( SMASKBIT32(i) & pHidden->mHandleIn ){
        pNew->u.vtab.mHandleIn |= MASKBIT32(iTerm);
      }else if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }

      /* Unless pbRetryLimit is non-NULL, there should be no LIMIT/OFFSET
      ** terms. And if there are any, they should follow all other terms. */
      assert( pbRetryLimit || !isLimitTerm(pTerm) );
      assert( !isLimitTerm(pTerm) || i>=nConstraint-2 );
      assert( !isLimitTerm(pTerm) || i==nConstraint-1 || isLimitTerm(pTerm+1) );

      if( isLimitTerm(pTerm) && (*pbIn || !allConstraintsUsed(pUsage, i)) ){
        /* If there is an IN(...) term handled as an == (separate call to
        ** xFilter for each value on the RHS of the IN) and a LIMIT or
        ** OFFSET term handled as well, the plan is unusable. Similarly,
        ** if there is a LIMIT/OFFSET and there are other unused terms,
        ** the plan cannot be used. In these cases set variable *pbRetryLimit
        ** to true to tell the caller to retry with LIMIT and OFFSET
        ** disabled. */
        freeIdxStr(pIdxInfo);
        *pbRetryLimit = 1;
        return SQLITE_OK;
      }
    }
  }

  pNew->nLTerm = mxTerm+1;
  for(i=0; i<=mxTerm; i++){
    if( pNew->aLTerm[i]==0 ){
      /* The non-zero argvIdx values must be contiguous.  Raise an
      ** error if they are not */
      sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pSTab->zName);
      freeIdxStr(pIdxInfo);
      return SQLITE_ERROR;
    }
  }
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->u.vtab.bIdxNumHex = (pIdxInfo->idxFlags&SQLITE_INDEX_SCAN_HEX)!=0;
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffffffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}